

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# staj_event.hpp
# Opt level: O2

double __thiscall
jsoncons::basic_staj_event<char>::as_double(basic_staj_event<char> *this,error_code *ec)

{
  double dVar1;
  chars_to f;
  
  switch(this->event_type_) {
  case key:
  case string_value:
    detail::chars_to::chars_to(&f);
    dVar1 = detail::chars_to::operator()(&f,(this->value_).string_data_,this->length_);
    std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
              ((_Vector_base<char,_std::allocator<char>_> *)&f);
    break;
  default:
    std::error_code::operator=(ec,not_double);
    dVar1 = 0.0;
    break;
  case int64_value:
    dVar1 = (double)(this->value_).int64_value_;
    break;
  case uint64_value:
    dVar1 = ((double)CONCAT44(0x45300000,(int)((ulong)(this->value_).int64_value_ >> 0x20)) -
            1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)(this->value_).int64_value_) - 4503599627370496.0);
    break;
  case half_value:
    dVar1 = binary::decode_half((this->value_).half_value_);
    return dVar1;
  case double_value:
    dVar1 = (double)(this->value_).int64_value_;
  }
  return dVar1;
}

Assistant:

double as_double(std::error_code& ec) const
    {
        switch (event_type_)
        {
            case staj_event_type::key:
            case staj_event_type::string_value:
            {
                jsoncons::detail::chars_to f;
                return f(value_.string_data_, length_);
            }
            case staj_event_type::double_value:
                return value_.double_value_;
            case staj_event_type::int64_value:
                return static_cast<double>(value_.int64_value_);
            case staj_event_type::uint64_value:
                return static_cast<double>(value_.uint64_value_);
            case staj_event_type::half_value:
            {
                double x = binary::decode_half(value_.half_value_);
                return static_cast<double>(x);
            }
            default:
                ec = conv_errc::not_double;
                return double();
        }
    }